

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::Expression> __thiscall minja::Parser::parseMathPow(Parser *this)

{
  bool bVar1;
  byte bVar2;
  runtime_error *prVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Op *in_RSI;
  element_type *in_RDI;
  shared_ptr<minja::Expression> sVar4;
  shared_ptr<minja::Expression> right;
  shared_ptr<minja::Expression> *left;
  shared_ptr<minja::BinaryOpExpr> *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  element_type *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Location *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  Parser *in_stack_ffffffffffffff68;
  __shared_ptr local_80 [23];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [4];
  SpaceHandling in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  Parser *in_stack_ffffffffffffffc8;
  Parser *in_stack_ffffffffffffffd8;
  
  this_00 = in_RDI;
  parseMathPlusMinus(in_stack_ffffffffffffffd8);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this_00);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Expected left side of \'math pow\' expression");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while( true ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    consumeToken(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    bVar2 = std::__cxx11::string::empty();
    bVar2 = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator(&local_69);
    if ((bVar2 & 1) == 0) {
      sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<minja::Expression>)
             sVar4.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>;
    }
    parseMathPlusMinus(in_stack_ffffffffffffffd8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_80);
    if (!bVar1) break;
    get_location(in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff54 = 4;
    std::
    make_shared<minja::BinaryOpExpr,minja::Location,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,minja::BinaryOpExpr::Op>
              (in_stack_ffffffffffffff58,
               (shared_ptr<minja::Expression> *)CONCAT44(4,in_stack_ffffffffffffff50),
               (shared_ptr<minja::Expression> *)this_00,in_RSI);
    std::shared_ptr<minja::Expression>::operator=
              ((shared_ptr<minja::Expression> *)CONCAT17(bVar2,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    std::shared_ptr<minja::BinaryOpExpr>::~shared_ptr((shared_ptr<minja::BinaryOpExpr> *)0x2ee32d);
    Location::~Location((Location *)0x2ee337);
    std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x2ee341);
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Expected right side of \'math pow\' expression");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Expression> parseMathPow() {
        auto left = parseMathPlusMinus();
        if (!left) throw std::runtime_error("Expected left side of 'math pow' expression");

        while (!consumeToken("**").empty()) {
            auto right = parseMathPlusMinus();
            if (!right) throw std::runtime_error("Expected right side of 'math pow' expression");
            left = std::make_shared<BinaryOpExpr>(get_location(), std::move(left), std::move(right), BinaryOpExpr::Op::MulMul);
        }
        return left;
    }